

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQChar * replace_substring_internal
                   (SQAllocContext allocctx,SQChar *s,SQInteger *buf_len,SQInteger *len,int pos,
                   SQInteger len_from,SQChar *to,SQInteger len_to)

{
  SQUnsignedInteger newsize;
  SQAllocContext in_RCX;
  long *in_RDX;
  SQChar *in_RSI;
  int in_R8D;
  SQUnsignedInteger in_R9;
  SQInteger d_size;
  undefined4 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd8;
  SQChar *local_10;
  
  newsize = CONCAT44(pos,in_stack_00000010) - in_R9;
  local_10 = in_RSI;
  if (0 < (long)newsize) {
    local_10 = (SQChar *)
               sq_realloc(in_RCX,(void *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,newsize);
    *in_RDX = newsize + *in_RDX;
  }
  if (newsize != 0) {
    memmove(local_10 + CONCAT44(pos,in_stack_00000010) + (long)in_R8D,
            local_10 + in_R9 + (long)in_R8D,(*(long *)in_RCX - (long)in_R8D) - in_R9);
  }
  memcpy(local_10 + in_R8D,(void *)len_from,CONCAT44(pos,in_stack_00000010));
  *(SQUnsignedInteger *)in_RCX = newsize + *(long *)in_RCX;
  return local_10;
}

Assistant:

static SQChar* replace_substring_internal(SQAllocContext allocctx, SQChar *s, SQInteger &buf_len, SQInteger &len,
    int pos, SQInteger len_from, const SQChar *to, SQInteger len_to)
{
    SQInteger d_size = len_to - len_from;
    if (d_size > 0) {
        s = (SQChar*)sq_realloc(allocctx, s, buf_len * sizeof(SQChar), (buf_len + d_size) * sizeof(SQChar));
        buf_len += d_size;
    }
    if (d_size != 0)
        memmove(s + pos + len_to, s + pos + len_from, (len - pos - len_from) * sizeof(SQChar));
    memcpy(s + pos, to, len_to * sizeof(SQChar));
    len += d_size;

    return s;
}